

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RendererTests.cpp
# Opt level: O1

void __thiscall
agge::tests::RendererTests::RenderingSingleCellsPreservesRenditionPositions(RendererTests *this)

{
  int *piVar1;
  int iVar2;
  int cover_1;
  uint uVar3;
  int *piVar4;
  int iVar5;
  int cover_00;
  int cover;
  int iVar6;
  cell cells2 [1];
  scanline_mockup sl2;
  scanline_mockup sl1;
  cell cells1 [1];
  string local_e8;
  LocationInfo local_c8;
  int local_a0 [4];
  scanline_mockup local_90;
  scanline_mockup local_68;
  int local_40 [4];
  
  local_68.excepted_y = -1000000;
  local_68.spans_log.
  super__Vector_base<agge::tests::(anonymous_namespace)::span,_std::allocator<agge::tests::(anonymous_namespace)::span>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.spans_log.
  super__Vector_base<agge::tests::(anonymous_namespace)::span,_std::allocator<agge::tests::(anonymous_namespace)::span>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  iVar6 = 0;
  local_68.spans_log.
  super__Vector_base<agge::tests::(anonymous_namespace)::span,_std::allocator<agge::tests::(anonymous_namespace)::span>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_68._inprogress = true;
  local_68._current_y = 0x7fffffff;
  local_90.excepted_y = -1000000;
  local_90.spans_log.
  super__Vector_base<agge::tests::(anonymous_namespace)::span,_std::allocator<agge::tests::(anonymous_namespace)::span>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_90.spans_log.
  super__Vector_base<agge::tests::(anonymous_namespace)::span,_std::allocator<agge::tests::(anonymous_namespace)::span>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_90.spans_log.
  super__Vector_base<agge::tests::(anonymous_namespace)::span,_std::allocator<agge::tests::(anonymous_namespace)::span>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_90._inprogress = true;
  local_90._current_y = 0x7fffffff;
  local_40[2] = 0;
  local_40[0] = 7;
  local_40[1] = 0x1400;
  local_a0[2] = 0;
  local_a0[0] = 0x13d62b;
  local_a0[1] = 0x1600;
  piVar4 = local_40;
  do {
    iVar5 = *piVar4;
    iVar2 = 0;
    do {
      piVar1 = piVar4;
      piVar4 = piVar1 + 3;
      iVar2 = iVar2 + piVar1[1];
      iVar6 = iVar6 + piVar1[2];
      if (piVar1 == local_40) break;
    } while (*piVar4 == iVar5);
    cover_00 = iVar6 * 0x200;
    if (iVar2 != 0) {
      anon_unknown_1::scanline_mockup::add_cell(&local_68,iVar5,cover_00 - iVar2);
      iVar5 = iVar5 + 1;
    }
    if (piVar1 == local_40) {
      local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_e8,
                 "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/RendererTests.cpp"
                 ,"");
      ut::LocationInfo::LocationInfo(&local_c8,&local_e8,0x65);
      ut::
      are_equal<agge::tests::(anonymous_namespace)::span,1ul,std::vector<agge::tests::(anonymous_namespace)::span,std::allocator<agge::tests::(anonymous_namespace)::span>>>
                ((span (*) [1])&DAT_001a0a80,&local_68.spans_log,&local_c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8.filename._M_dataplus._M_p != &local_c8.filename.field_2) {
        operator_delete(local_c8.filename._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
        operator_delete(local_e8._M_dataplus._M_p);
      }
      uVar3 = 0;
      piVar4 = local_a0;
      do {
        iVar6 = *piVar4;
        iVar5 = 0;
        do {
          piVar1 = piVar4;
          piVar4 = piVar1 + 3;
          iVar5 = iVar5 + piVar1[1];
          uVar3 = uVar3 + piVar1[2];
          if (piVar1 == local_a0) break;
        } while (*piVar4 == iVar6);
        if (iVar5 != 0) {
          anon_unknown_1::scanline_mockup::add_cell(&local_90,iVar6,uVar3 * 0x200 - iVar5);
          iVar6 = iVar6 + 1;
        }
        if (piVar1 == local_a0) {
          local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_e8,
                     "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/RendererTests.cpp"
                     ,"");
          ut::LocationInfo::LocationInfo(&local_c8,&local_e8,0x6d);
          ut::
          are_equal<agge::tests::(anonymous_namespace)::span,1ul,std::vector<agge::tests::(anonymous_namespace)::span,std::allocator<agge::tests::(anonymous_namespace)::span>>>
                    ((span (*) [1])&DAT_001a0a90,&local_90.spans_log,&local_c8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c8.filename._M_dataplus._M_p != &local_c8.filename.field_2) {
            operator_delete(local_c8.filename._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
            operator_delete(local_e8._M_dataplus._M_p);
          }
          if (local_90.spans_log.
              super__Vector_base<agge::tests::(anonymous_namespace)::span,_std::allocator<agge::tests::(anonymous_namespace)::span>_>
              ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_90.spans_log.
                            super__Vector_base<agge::tests::(anonymous_namespace)::span,_std::allocator<agge::tests::(anonymous_namespace)::span>_>
                            ._M_impl.super__Vector_impl_data._M_start);
          }
          if (local_68.spans_log.
              super__Vector_base<agge::tests::(anonymous_namespace)::span,_std::allocator<agge::tests::(anonymous_namespace)::span>_>
              ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_68.spans_log.
                            super__Vector_base<agge::tests::(anonymous_namespace)::span,_std::allocator<agge::tests::(anonymous_namespace)::span>_>
                            ._M_impl.super__Vector_impl_data._M_start);
          }
          return;
        }
        if ((uVar3 & 0x7fffff) != 0 && *piVar4 - iVar6 != 0) {
          anon_unknown_1::scanline_mockup::add_span(&local_90,iVar6,*piVar4 - iVar6,uVar3 * 0x200);
        }
      } while( true );
    }
    if (cover_00 != 0 && *piVar4 - iVar5 != 0) {
      anon_unknown_1::scanline_mockup::add_span(&local_68,iVar5,*piVar4 - iVar5,cover_00);
    }
  } while( true );
}

Assistant:

test( RenderingSingleCellsPreservesRenditionPositions )
			{
				// INIT
				scanline_mockup sl1, sl2;
				mocks::cell cells1[] = { { 7, 10 * 512, 0 }, }, cells2[] = { { 1300011, 11 * 512, 0 }, };

				// ACT
				sweep_scanline<8>(sl1, begin(cells1), end(cells1), bypass_alpha());

				// ASSERT
				span reference1[] = { { 0x7fffffff, 7, 0, -10 * 512 }, };

				assert_equal(reference1, sl1.spans_log);

				// ACT
				sweep_scanline<8>(sl2, begin(cells2), end(cells2), bypass_alpha());

				// ASSERT
				span reference2[] = { { 0x7fffffff, 1300011, 0, -11 * 512 }, };

				assert_equal(reference2, sl2.spans_log);
			}